

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

int __thiscall QDockAreaLayoutInfo::remove(QDockAreaLayoutInfo *this,char *__filename)

{
  int index;
  QDockAreaLayoutInfo *this_00;
  QArrayData *pQVar1;
  CutResult CVar2;
  int extraout_EAX;
  pointer pQVar3;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype p;
  QArrayData *local_68;
  void *pvStack_60;
  long local_58;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  index = **(int **)(__filename + 8);
  if (*(ulong *)(__filename + 0x10) < 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QList<QDockAreaLayoutItem>::removeAt(&this->item_list,(long)index);
      return extraout_EAX;
    }
  }
  else {
    pQVar3 = QList<QDockAreaLayoutItem>::data(&this->item_list);
    this_00 = pQVar3[index].subinfo;
    local_40 = 1;
    local_48 = -1;
    CVar2 = QtPrivate::QContainerImplHelper::mid
                      (*(qsizetype *)(__filename + 0x10),&local_40,&local_48);
    if (CVar2 < Full) {
      local_68 = (QArrayData *)0x0;
      pvStack_60 = (void *)0x0;
      local_58 = 0;
      remove(this_00,(char *)&local_68);
    }
    else {
      if (CVar2 == Full) {
        local_68 = *(QArrayData **)__filename;
        pvStack_60 = *(void **)(__filename + 8);
        local_58 = *(long *)(__filename + 0x10);
        if (local_68 != (QArrayData *)0x0) {
          LOCK();
          (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pvStack_60 = (void *)QArrayData::allocate(&local_68,4,0x10,local_48,KeepSize);
        local_58 = local_48;
        pQVar1 = local_68;
        if (local_48 != 0) {
          memcpy(pvStack_60,(void *)(local_40 * 4 + *(long *)(__filename + 8)),local_48 * 4);
        }
        local_68 = pQVar1;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,4,0x10);
          }
        }
      }
      pQVar1 = local_68;
      remove(this_00,(char *)&local_68);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,4,0x10);
        }
      }
    }
    unnest(this,index);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::remove(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());

    if (path.size() > 1) {
        const int index = path.first();
        QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        item.subinfo->remove(path.mid(1));
        unnest(index);
    } else {
        int index = path.first();
        item_list.removeAt(index);
    }
}